

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint _c;
  long lVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  pointer pMVar8;
  int *piVar9;
  pointer pRVar10;
  pointer pRVar11;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar12;
  int iVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  Rect *pRVar17;
  ulong uVar18;
  float *pb;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  void *pvVar21;
  float *pfVar22;
  void *pvVar23;
  ulong uVar24;
  long lVar25;
  void *pvVar26;
  ulong uVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  Mat m;
  Mat proposals;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  unsigned_long *local_258;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_248;
  unsigned_long local_228;
  uint local_21c;
  vector<float,_std::allocator<float>_> local_218;
  vector<float,_std::allocator<float>_> local_1f8;
  int local_1e0;
  Allocator *local_1d8;
  undefined8 local_1d0;
  int iStack_1c8;
  undefined4 uStack_1c4;
  int iStack_1c0;
  long local_1b8;
  float *local_1b0;
  int local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  Mat local_188;
  pointer local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  ulong local_110;
  ulong local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e8;
  long local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_138 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_f8 = (ulong)local_138->w;
  local_f0 = (ulong)(uint)local_138->h;
  _c = (this->anchors).h;
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  local_21c = local_138->h * local_138->w;
  local_e8 = top_blobs;
  Mat::create(&local_188,4,local_21c,_c,4,(Allocator *)0x0);
  local_110 = (ulong)_c;
  if (0 < (int)_c) {
    local_a8 = local_f8 & 0xffffffff;
    local_1a8 = local_188.dims;
    local_d0 = local_188.data;
    local_e0 = (long)(this->anchors).w * (this->anchors).elemsize;
    local_d8 = local_188.cstep * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
    local_1a4 = (float)this->feat_stride;
    local_100 = (this->anchors).data;
    lVar16 = (long)local_188.w * CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
    local_b8 = lVar16 * local_a8;
    local_c0 = local_f8 * 4;
    local_118 = 3;
    local_120 = 2;
    local_128 = 1;
    local_130 = 0;
    uVar27 = 0;
    do {
      local_1b0 = (float *)(local_d8 * uVar27 + (long)local_d0);
      local_108 = uVar27;
      if (0 < (int)local_f0) {
        local_c8 = local_e0 * uVar27;
        fVar29 = (float)((ulong)*(undefined8 *)((long)local_100 + local_c8) >> 0x20);
        uVar3 = *(undefined8 *)((long)local_100 + local_c8 + 8);
        fVar33 = (float)uVar3 - (float)*(undefined8 *)((long)local_100 + local_c8);
        fVar35 = (float)((ulong)uVar3 >> 0x20) - fVar29;
        pvVar26 = local_138[1].data;
        fStack_80 = fVar33 * 0.5;
        fStack_7c = fVar35 * 0.5;
        local_1a0 = (float)this->feat_stride;
        lVar25 = local_138[1].cstep * local_138[1].elemsize;
        pvVar23 = (void *)(lVar25 * local_118 + (long)pvVar26);
        pvVar14 = (void *)(lVar25 * local_120 + (long)pvVar26);
        pvVar21 = (void *)(lVar25 * local_128 + (long)pvVar26);
        pvVar26 = (void *)(lVar25 * local_130 + (long)pvVar26);
        uVar27 = 0;
        local_78 = CONCAT44(fVar35,fVar33);
        uStack_70 = 0;
        fVar30 = fVar29;
        fVar34 = fVar29;
        fVar32 = fVar29;
        local_98 = fVar35;
        fStack_94 = fVar35;
        fStack_90 = fVar35;
        fStack_8c = fVar35;
        do {
          local_b0 = uVar27;
          if (0 < (int)local_f8) {
            fVar36 = *(float *)((long)local_100 + local_c8);
            uStack_194 = 0;
            uStack_190 = 0;
            uStack_18c = 0;
            uVar27 = 0;
            pfVar22 = local_1b0;
            local_a0 = pvVar21;
            local_68 = fVar29;
            fStack_64 = fVar30;
            fStack_60 = fVar34;
            fStack_5c = fVar32;
            do {
              local_19c = *(float *)((long)pvVar23 + uVar27 * 4);
              local_48._4_4_ = 0;
              local_48._0_4_ = (*(float *)((long)local_a0 + uVar27 * 4) + 0.5) * fVar35;
              local_48._8_4_ = (*(float *)((long)pvVar26 + uVar27 * 4) + 0.5) * fVar33;
              local_48._12_4_ = 0;
              local_198 = fVar36;
              local_58 = expf(*(float *)((long)pvVar14 + uVar27 * 4));
              fVar29 = expf(local_19c);
              *pfVar22 = ((float)local_48._8_4_ + local_198) - local_58 * fStack_80;
              pfVar22[1] = ((float)local_48._0_4_ + local_68) - fVar29 * fStack_7c;
              pfVar22[2] = (float)local_48._8_4_ + local_198 + local_58 * fStack_80;
              pfVar22[3] = (float)local_48._0_4_ + local_68 + fVar29 * fStack_7c;
              fVar36 = local_198 + local_1a0;
              uVar27 = uVar27 + 1;
              pfVar22 = (float *)((long)pfVar22 + lVar16);
              pvVar21 = local_a0;
              fVar29 = local_68;
              fVar30 = fStack_64;
              fVar34 = fStack_60;
              fVar32 = fStack_5c;
              fVar33 = (float)local_78;
              fVar35 = local_98;
            } while (local_a8 != uVar27);
          }
          fVar29 = fVar29 + local_1a4;
          uVar27 = local_b0 + 1;
          local_1b0 = (float *)((long)local_1b0 + local_b8);
          pvVar23 = (void *)((long)pvVar23 + local_c0);
          pvVar14 = (void *)((long)pvVar14 + local_c0);
          pvVar21 = (void *)((long)pvVar21 + local_c0);
          pvVar26 = (void *)((long)pvVar26 + local_c0);
        } while (uVar27 != local_f0);
      }
      uVar27 = local_108 + 1;
      local_118 = local_118 + 4;
      local_120 = local_120 + 4;
      local_128 = local_128 + 4;
      local_130 = local_130 + 4;
    } while (uVar27 != local_110);
  }
  pMVar8 = local_138;
  uVar27 = (ulong)local_21c;
  if (0 < (int)local_110) {
    fVar29 = (float)*local_138[2].data;
    fVar30 = (float)((ulong)*local_138[2].data >> 0x20);
    uVar18 = 0;
    do {
      pauVar19 = (undefined1 (*) [16])
                 (local_188.cstep *
                  CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize) * uVar18 +
                 (long)local_188.data);
      uVar20 = uVar27;
      if (0 < (int)local_21c) {
        do {
          auVar31._4_4_ = fVar29 + -1.0;
          auVar31._0_4_ = fVar30 + -1.0;
          auVar31._8_4_ = fVar30 + -1.0;
          auVar31._12_4_ = fVar29 + -1.0;
          auVar31 = minps(*pauVar19,auVar31);
          auVar31 = maxps(auVar31,ZEXT816(0));
          *pauVar19 = auVar31;
          pauVar19 = (undefined1 (*) [16])
                     (*pauVar19 +
                     (long)local_188.w *
                     CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_110);
  }
  local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_110) {
    local_198 = (float)this->min_size * *(float *)((long)local_138[2].data + 8);
    uVar20 = 0;
    uVar18 = local_110;
    do {
      if (local_188.dims == 3) {
        lVar16 = local_188.cstep * uVar20 *
                 CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
        local_1d0._0_4_ = 2;
        iStack_1c0 = 1;
      }
      else {
        lVar16 = local_188.cstep * uVar20 *
                 CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize);
        local_1d0._0_4_ = 3;
        iStack_1c0 = local_188.d;
      }
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(lVar16 + (long)local_188.data);
      uStack_1c4 = 1;
      local_1d0._4_4_ = local_188.w;
      local_1d8 = local_188.allocator;
      local_1e0 = local_188.elempack;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = local_188.elemsize._4_4_;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = (undefined4)local_188.elemsize;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      iStack_1c8 = local_188.h;
      local_1b8 = (long)local_188.h * (long)local_188.w;
      if (0 < (int)local_21c) {
        pfVar22 = (float *)(pMVar8->elemsize * pMVar8->cstep * uVar18 + (long)pMVar8->data);
        uVar24 = 0;
        do {
          lVar16 = (long)local_1d0._4_4_ * uVar24 *
                   CONCAT44(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_);
          if ((local_198 <=
               (*(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar16 + 8) + 1.0) -
               *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar16)) &&
             (local_198 <=
              (*(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar16 + 0xc) + 1.0) -
              *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar16 + 4))) {
            local_268._4_4_ =
                 *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar16 + 4);
            local_268._0_4_ =
                 *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar16);
            uStack_260._0_4_ =
                 *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar16 + 8);
            uStack_260._4_4_ =
                 *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar16 + 0xc);
            if (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_248,
                         (iterator)
                         local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_268);
            }
            else {
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 =
                   *(float *)((long)local_1f8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar16);
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_268._4_4_;
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)uStack_260;
              (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = uStack_260._4_4_;
              local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_218,
                         (iterator)
                         local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar22);
            }
            else {
              *local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar22;
              local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar24 = uVar24 + 1;
          pfVar22 = pfVar22 + 1;
        } while (uVar27 != uVar24);
      }
      uVar24 = local_110;
      piVar9 = (int *)CONCAT44(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      local_1b8 = 0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      local_1e0 = 0;
      local_1d0 = 0;
      iStack_1c8 = 0;
      uStack_1c4 = 0;
      iStack_1c0 = 0;
      uVar20 = uVar20 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar24);
  }
  if ((local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    qsort_descent_inplace<ncnn::Rect>
              (&local_248,&local_218,0,
               (int)((ulong)((long)local_218.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_218.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
  }
  iVar13 = this->pre_nms_topN;
  if ((0 < (long)iVar13) &&
     (iVar13 < (int)((ulong)((long)local_248.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_248.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_248,(long)iVar13);
    std::vector<float,_std::allocator<float>_>::resize(&local_218,(long)this->pre_nms_topN);
  }
  pRVar11 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar10 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_268 = (undefined1  [8])0x0;
  local_258 = (unsigned_long *)0x0;
  uStack_260 = (unsigned_long *)0x0;
  local_198 = this->nms_thresh;
  uVar27 = (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector(&local_1f8,uVar27,(allocator_type *)&local_228)
  ;
  if (pRVar11 == pRVar10) {
    local_228 = 0;
  }
  else {
    pfVar22 = &(local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    lVar16 = 0;
    do {
      uVar2 = ((Rect *)(pfVar22 + -2))->x1;
      uVar4 = ((Rect *)(pfVar22 + -2))->y1;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar16] =
           ((float)((ulong)*(undefined8 *)pfVar22 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar22 - (float)uVar2);
      lVar16 = lVar16 + 1;
      pfVar22 = pfVar22 + 4;
    } while (uVar27 + (uVar27 == 0) != lVar16);
    local_228 = 0;
    if (pRVar11 != pRVar10) {
      do {
        if ((long)uStack_260 - (long)local_268 == 0) {
LAB_00200fdb:
          if (uStack_260 == local_258) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_268,uStack_260,
                       &local_228);
          }
          else {
            *uStack_260 = local_228;
            uStack_260 = uStack_260 + 1;
          }
        }
        else {
          lVar16 = (long)uStack_260 - (long)local_268 >> 3;
          fVar29 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[local_228].x1;
          bVar28 = true;
          lVar25 = 0;
          do {
            lVar5 = *(long *)((long)local_268 + lVar25 * 8);
            fVar30 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5].x2;
            fVar34 = 0.0;
            if (fVar29 <= fVar30) {
              pRVar17 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar5;
              fVar32 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[local_228].x2;
              fVar33 = pRVar17->x1;
              if (fVar33 <= fVar32) {
                fVar35 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_228].y1;
                fVar36 = pRVar17->y2;
                if (fVar35 <= fVar36) {
                  fVar1 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_228].y2;
                  fVar37 = pRVar17->y1;
                  if (fVar37 <= fVar1) {
                    if (fVar32 <= fVar30) {
                      fVar30 = fVar32;
                    }
                    if (fVar33 <= fVar29) {
                      fVar33 = fVar29;
                    }
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    if (fVar37 <= fVar35) {
                      fVar37 = fVar35;
                    }
                    fVar34 = (fVar36 - fVar37) * (fVar30 - fVar33);
                  }
                }
              }
            }
            if (local_198 <
                fVar34 / ((local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[local_228] - fVar34) +
                         local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar5])) {
              bVar28 = false;
            }
            lVar25 = lVar25 + 1;
          } while (lVar16 + (ulong)(lVar16 == 0) != lVar25);
          if (bVar28) goto LAB_00200fdb;
        }
        local_228 = local_228 + 1;
      } while (local_228 < uVar27);
    }
  }
  if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar12 = local_e8;
  uVar27 = (ulong)((long)uStack_260 - (long)local_268) >> 3;
  uVar18 = uVar27 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar27) {
    uVar18 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar13 = (int)uVar18;
  Mat::create(this_00,4,1,iVar13,4,(Allocator *)0x0);
  iVar15 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (0 < iVar13) {
      sVar6 = this_00->cstep;
      sVar7 = this_00->elemsize;
      pfVar22 = (float *)((long)this_00->data + 0xc);
      uVar27 = 0;
      do {
        lVar16 = *(long *)((long)local_268 + uVar27 * 8);
        pfVar22[-3] = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16].x1;
        pfVar22[-2] = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16].y1;
        pfVar22[-1] = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16].x2;
        *pfVar22 = local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16].y2;
        uVar27 = uVar27 + 1;
        pfVar22 = (float *)((long)pfVar22 + sVar6 * sVar7);
      } while (uVar18 != uVar27);
    }
    pMVar8 = (pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                   -0x71c71c71c71c71c7)) {
      Mat::create(pMVar8 + 1,1,1,iVar13,4,(Allocator *)0x0);
      if (pMVar8[1].data == (void *)0x0) {
        bVar28 = true;
      }
      else {
        bVar28 = (long)pMVar8[1].c * pMVar8[1].cstep == 0;
      }
      if (bVar28) goto LAB_002011b3;
      if (0 < iVar13) {
        pfVar22 = (float *)pMVar8[1].data;
        sVar6 = pMVar8[1].cstep;
        sVar7 = pMVar8[1].elemsize;
        uVar27 = 0;
        do {
          *pfVar22 = local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(long *)((long)local_268 + uVar27 * 8)];
          uVar27 = uVar27 + 1;
          pfVar22 = (float *)((long)pfVar22 + sVar6 * sVar7);
        } while (uVar18 != uVar27);
      }
    }
    iVar15 = 0;
  }
LAB_002011b3:
  if (local_268 != (undefined1  [8])0x0) {
    operator_delete((void *)local_268,(long)local_258 - (long)local_268);
  }
  if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}